

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O1

SUNLinearSolver SUNLinSol_SPBCGS(N_Vector y,int pretype,int maxl,SUNContext_conflict sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  SUNLinearSolver p_Var2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  if ((uint)pretype < 4) {
    iVar5 = pretype;
  }
  iVar6 = 5;
  if (0 < maxl) {
    iVar6 = maxl;
  }
  p_Var2 = (SUNLinearSolver)SUNLinSolNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNLinSolGetType_SPBCGS;
  p_Var1->getid = SUNLinSolGetID_SPBCGS;
  p_Var1->setatimes = SUNLinSolSetATimes_SPBCGS;
  p_Var1->setpreconditioner = SUNLinSolSetPreconditioner_SPBCGS;
  p_Var1->setscalingvectors = SUNLinSolSetScalingVectors_SPBCGS;
  p_Var1->setzeroguess = SUNLinSolSetZeroGuess_SPBCGS;
  p_Var1->initialize = SUNLinSolInitialize_SPBCGS;
  p_Var1->setup = SUNLinSolSetup_SPBCGS;
  p_Var1->solve = SUNLinSolSolve_SPBCGS;
  p_Var1->numiters = SUNLinSolNumIters_SPBCGS;
  p_Var1->resnorm = SUNLinSolResNorm_SPBCGS;
  p_Var1->resid = SUNLinSolResid_SPBCGS;
  p_Var1->lastflag = SUNLinSolLastFlag_SPBCGS;
  p_Var1->space = SUNLinSolSpace_SPBCGS;
  p_Var1->free = SUNLinSolFree_SPBCGS;
  piVar3 = (int *)malloc(0x90);
  p_Var2->content = piVar3;
  piVar3[6] = 0;
  *piVar3 = iVar6;
  piVar3[1] = iVar5;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  piVar3[0x20] = 0;
  piVar3[0x21] = 0;
  piVar3[0x22] = 0;
  piVar3[0x23] = 0;
  piVar3[0x1c] = 0;
  piVar3[0x1d] = 0;
  piVar3[0x1e] = 0;
  piVar3[0x1f] = 0;
  piVar3[0x18] = 0;
  piVar3[0x19] = 0;
  piVar3[0x1a] = 0;
  piVar3[0x1b] = 0;
  piVar3[0x14] = 0;
  piVar3[0x15] = 0;
  piVar3[0x16] = 0;
  piVar3[0x17] = 0;
  piVar3[0x10] = 0;
  piVar3[0x11] = 0;
  piVar3[0x12] = 0;
  piVar3[0x13] = 0;
  piVar3[0xc] = 0;
  piVar3[0xd] = 0;
  piVar3[0xe] = 0;
  piVar3[0xf] = 0;
  piVar3[8] = 0;
  piVar3[9] = 0;
  piVar3[10] = 0;
  piVar3[0xb] = 0;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x18) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x16) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1a) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1c) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1e) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x20) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x22) = uVar4;
  return p_Var2;
}

Assistant:

SUNLinearSolver SUNLinSol_SPBCGS(N_Vector y, int pretype, int maxl,
                                 SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_SPBCGS content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE) && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
  {
    pretype = SUN_PREC_NONE;
  }
  if (maxl <= 0) { maxl = SUNSPBCGS_MAXL_DEFAULT; }

  /* check that the supplied N_Vector supports all requisite operations */
  SUNAssertNull((y->ops->nvclone) && (y->ops->nvdestroy) &&
                  (y->ops->nvlinearsum) && (y->ops->nvprod) &&
                  (y->ops->nvdiv) && (y->ops->nvscale) && (y->ops->nvdotprod),
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_SPBCGS;
  S->ops->getid             = SUNLinSolGetID_SPBCGS;
  S->ops->setatimes         = SUNLinSolSetATimes_SPBCGS;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPBCGS;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPBCGS;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_SPBCGS;
  S->ops->initialize        = SUNLinSolInitialize_SPBCGS;
  S->ops->setup             = SUNLinSolSetup_SPBCGS;
  S->ops->solve             = SUNLinSolSolve_SPBCGS;
  S->ops->numiters          = SUNLinSolNumIters_SPBCGS;
  S->ops->resnorm           = SUNLinSolResNorm_SPBCGS;
  S->ops->resid             = SUNLinSolResid_SPBCGS;
  S->ops->lastflag          = SUNLinSolLastFlag_SPBCGS;
  S->ops->space             = SUNLinSolSpace_SPBCGS;
  S->ops->free              = SUNLinSolFree_SPBCGS;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPBCGS)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->last_flag = 0;
  content->maxl      = maxl;
  content->pretype   = pretype;
  content->zeroguess = SUNFALSE;
  content->numiters  = 0;
  content->resnorm   = ZERO;
  content->r_star    = NULL;
  content->r         = NULL;
  content->p         = NULL;
  content->q         = NULL;
  content->u         = NULL;
  content->Ap        = NULL;
  content->vtemp     = NULL;
  content->s1        = NULL;
  content->s2        = NULL;
  content->ATimes    = NULL;
  content->ATData    = NULL;
  content->Psetup    = NULL;
  content->Psolve    = NULL;
  content->PData     = NULL;

  /* Allocate content */
  content->r_star = N_VClone(y);
  SUNCheckLastErrNull();

  content->r = N_VClone(y);
  SUNCheckLastErrNull();

  content->p = N_VClone(y);
  SUNCheckLastErrNull();

  content->q = N_VClone(y);
  SUNCheckLastErrNull();

  content->u = N_VClone(y);
  SUNCheckLastErrNull();

  content->Ap = N_VClone(y);
  SUNCheckLastErrNull();

  content->vtemp = N_VClone(y);
  SUNCheckLastErrNull();

  return (S);
}